

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void __thiscall
rw::ps2::MatPipeline::setTriBufferSizes(MatPipeline *this,uint32 inputStride,uint32 bufferSize)

{
  long lVar1;
  
  this->inputStride = inputStride;
  this->triListCount = (bufferSize / 3 & 0x7ffffffc) * 3;
  this->triStripCount = bufferSize & 0xfffffffc;
  lVar1 = 4;
  while( true ) {
    if (lVar1 == 0xe) {
      return;
    }
    if ((this->attribs[lVar1 + -4] != (PipeAttribute *)0x0) &&
       ((this->attribs[lVar1 + -4]->attrib & 6) != 0)) break;
    lVar1 = lVar1 + 1;
  }
  this->triStripCount = bufferSize - 2 & 0xfffffffc | 2;
  return;
}

Assistant:

void
MatPipeline::setTriBufferSizes(uint32 inputStride, uint32 bufferSize)
{
	PipeAttribute *a;

	this->inputStride = inputStride;
	uint32 numTLtris = bufferSize/3;
	this->triListCount = (numTLtris & ~3) * 3;
	this->triStripCount = bufferSize & ~3;
	for(uint i = 0; i < nelem(this->attribs); i++){
		a = this->attribs[i];
		if(a && a->attrib & AT_RW){
			// broken out attribs have different requirement
			// because we have to be able to restart a strip
			// at an aligned offset
			this->triStripCount = ((bufferSize-2) & ~3)+2;
			return;
		}
	}
}